

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::UpdateInputEvents(bool trickle_fast_inputs)

{
  ImVector<ImGuiInputEvent> *this;
  ImGuiKeyData *pIVar1;
  float *pfVar2;
  float fVar3;
  bool bVar4;
  int iVar5;
  ImGuiContext *pIVar6;
  uint uVar7;
  ImGuiKeyModFlags IVar8;
  ImGuiInputEvent *extraout_RAX;
  ImGuiInputEvent *pIVar9;
  uint *puVar10;
  uint *puVar11;
  uint uVar12;
  long lVar13;
  undefined7 in_register_00000039;
  long lVar14;
  long lVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  unsigned_short local_d2;
  ulong local_d0;
  long local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  float local_a8;
  float local_a4;
  ImGuiIO *local_a0;
  ImVector<unsigned_short> *local_98;
  ImGuiKeyData *local_90;
  ImBitArray<645,_0> key_changed_mask;
  
  pIVar6 = GImGui;
  uVar7 = 0;
  local_b8 = 0;
  if ((int)CONCAT71(in_register_00000039,trickle_fast_inputs) != 0) {
    local_b8 = (ulong)(GImGui->WantTextInputNextFrame == 1);
  }
  local_a0 = &GImGui->IO;
  key_changed_mask.Storage[0x10] = 0;
  key_changed_mask.Storage[0x11] = 0;
  key_changed_mask.Storage[0x12] = 0;
  key_changed_mask.Storage[0x13] = 0;
  key_changed_mask.Storage[0xc] = 0;
  key_changed_mask.Storage[0xd] = 0;
  key_changed_mask.Storage[0xe] = 0;
  key_changed_mask.Storage[0xf] = 0;
  key_changed_mask.Storage[8] = 0;
  key_changed_mask.Storage[9] = 0;
  key_changed_mask.Storage[10] = 0;
  key_changed_mask.Storage[0xb] = 0;
  key_changed_mask.Storage[4] = 0;
  key_changed_mask.Storage[5] = 0;
  key_changed_mask.Storage[6] = 0;
  key_changed_mask.Storage[7] = 0;
  key_changed_mask.Storage[0] = 0;
  key_changed_mask.Storage[1] = 0;
  key_changed_mask.Storage[2] = 0;
  key_changed_mask.Storage[3] = 0;
  key_changed_mask.Storage[0x14] = 0;
  this = &GImGui->InputEventsQueue;
  local_98 = &(GImGui->IO).InputQueueCharacters;
  local_90 = (GImGui->IO).KeysData;
  lVar15 = 0;
  bVar16 = false;
  local_b0 = 0;
  local_d0 = 0;
  local_c0 = 0;
  for (lVar13 = 0; lVar13 < this->Size; lVar13 = lVar13 + 1) {
    pIVar9 = (pIVar6->InputEventsQueue).Data;
    switch(*(undefined4 *)((long)&pIVar9->Type + lVar15)) {
    case 1:
      fVar18 = *(float *)((long)&pIVar9->field_2 + lVar15);
      fVar17 = *(float *)((long)&pIVar9->field_2 + lVar15 + 4);
      if ((-256000.0 <= fVar18) && (-256000.0 <= fVar17)) {
        local_a8 = fVar17;
        local_a4 = ImFloorSigned(fVar18);
        fVar17 = ImFloorSigned(local_a8);
        pIVar9 = extraout_RAX;
        fVar18 = local_a4;
      }
      fVar3 = (pIVar6->IO).MousePos.x;
      if ((fVar3 == fVar18) && (!NAN(fVar3) && !NAN(fVar18))) {
        fVar3 = (pIVar6->IO).MousePos.y;
        if ((fVar3 == fVar17) && (!NAN(fVar3) && !NAN(fVar17))) break;
      }
      if ((trickle_fast_inputs) &&
         ((((uVar7 != 0 || ((local_d0 & 1) != 0)) || ((local_b0 & 1) != 0)) || (bVar16))))
      goto LAB_0010eb4b;
      (pIVar6->IO).MousePos.x = fVar18;
      (pIVar6->IO).MousePos.y = fVar17;
      local_c0 = CONCAT71((int7)((ulong)pIVar9 >> 8),1);
      break;
    case 2:
      fVar18 = *(float *)((long)&pIVar9->field_2 + lVar15);
      if ((((fVar18 != 0.0) || (NAN(fVar18))) ||
          (fVar17 = *(float *)((long)&pIVar9->field_2 + lVar15 + 4), fVar17 != 0.0)) ||
         (NAN(fVar17))) {
        if ((trickle_fast_inputs) && ((local_d0 & 1) != 0 || uVar7 != 0)) goto LAB_0010eb4b;
        (pIVar6->IO).MouseWheelH = fVar18 + (pIVar6->IO).MouseWheelH;
        (pIVar6->IO).MouseWheel =
             *(float *)((long)&pIVar9->field_2 + lVar15 + 4) + (pIVar6->IO).MouseWheel;
        local_d0 = CONCAT71((int7)((ulong)pIVar9 >> 8),1);
      }
      break;
    case 3:
      iVar5 = *(int *)((long)&pIVar9->field_2 + lVar15);
      bVar4 = *(bool *)((long)&pIVar9->field_2 + lVar15 + 4);
      if ((pIVar6->IO).MouseDown[iVar5] != bVar4) {
        uVar12 = 1 << ((byte)iVar5 & 0x1f);
        if ((trickle_fast_inputs) && (((uVar7 & uVar12) != 0 || ((local_d0 & 1) != 0))))
        goto LAB_0010eb4b;
        (pIVar6->IO).MouseDown[iVar5] = bVar4;
        uVar7 = uVar7 | uVar12;
      }
      break;
    case 4:
      uVar12 = *(uint *)((long)&pIVar9->field_2 + lVar15);
      pIVar1 = local_90 + (int)uVar12;
      bVar4 = *(bool *)((long)&pIVar9->field_2 + lVar15 + 4);
      if (local_90[(int)uVar12].Down == bVar4) {
        pfVar2 = (float *)((long)&pIVar9->field_2 + lVar15 + 8);
        if ((pIVar1->AnalogValue == *pfVar2) && (!NAN(pIVar1->AnalogValue) && !NAN(*pfVar2))) break;
      }
      else if ((trickle_fast_inputs) &&
              ((((key_changed_mask.Storage[(int)uVar12 >> 5] >> (uVar12 & 0x1f) & 1) != 0 ||
                (bVar16)) || (uVar7 != 0)))) goto LAB_0010eb4b;
      pIVar1->Down = bVar4;
      pIVar1->AnalogValue = *(float *)((long)&pIVar9->field_2 + lVar15 + 8);
      key_changed_mask.Storage[(int)uVar12 >> 5] =
           key_changed_mask.Storage[(int)uVar12 >> 5] | 1 << ((byte)uVar12 & 0x1f);
      puVar10 = &switchD_0010ea64::switchdataD_0016a654;
      puVar11 = (uint *)(ulong)uVar12;
      switch(uVar12) {
      case 0x281:
        (pIVar6->IO).KeyCtrl = bVar4;
        break;
      case 0x282:
        (pIVar6->IO).KeyShift = bVar4;
        break;
      case 0x283:
        (pIVar6->IO).KeyAlt = bVar4;
        break;
      case 0x284:
        (pIVar6->IO).KeySuper = bVar4;
        break;
      default:
        goto switchD_0010ea64_default;
      }
      local_c8 = lVar13;
      IVar8 = GetMergedKeyModFlags();
      (pIVar6->IO).KeyMods = IVar8;
      puVar11 = puVar10;
      lVar13 = local_c8;
switchD_0010ea64_default:
      (pIVar6->IO).KeysDown[(int)uVar12] = bVar4;
      lVar14 = (long)(pIVar6->IO).KeyMap[(int)uVar12];
      local_b0 = CONCAT71((int7)((ulong)puVar11 >> 8),1);
      if (lVar14 != -1) {
        (pIVar6->IO).KeysDown[lVar14] = pIVar1->Down;
      }
      break;
    case 5:
      if (trickle_fast_inputs) {
        if ((local_b0 & 1) == 0) {
          if (uVar7 != 0 || (local_c0 & 1) != 0) goto LAB_0010eb4b;
        }
        else if ((((byte)local_b8 | (byte)local_c0) & 1) != 0 || uVar7 != 0) goto LAB_0010eb4b;
        if ((local_d0 & 1) != 0) goto LAB_0010eb4b;
      }
      uVar12 = *(uint *)((long)&pIVar9->field_2 + lVar15);
      local_d2 = (unsigned_short)uVar12;
      if (0xffff < uVar12) {
        local_d2 = 0xfffd;
      }
      ImVector<unsigned_short>::push_back(local_98,&local_d2);
      if ((char)local_b8 != '\0') {
        bVar16 = true;
      }
      break;
    case 6:
      (pIVar6->IO).AppFocusLost = (bool)(*(byte *)((long)&pIVar9->field_2 + lVar15) ^ 1);
    }
    lVar15 = lVar15 + 0x18;
  }
LAB_0010eb4b:
  lVar14 = 0;
  local_c8 = lVar13;
  while (bVar16 = lVar13 != 0, lVar13 = lVar13 + -1, bVar16) {
    ImVector<ImGuiInputEvent>::push_back
              (&pIVar6->InputEventsTrail,
               (ImGuiInputEvent *)((long)&((pIVar6->InputEventsQueue).Data)->Type + lVar14));
    lVar14 = lVar14 + 0x18;
  }
  if (this->Size == (int)local_c8) {
    ImVector<ImGuiInputEvent>::resize(this,0);
  }
  else {
    pIVar9 = (pIVar6->InputEventsQueue).Data;
    ImVector<ImGuiInputEvent>::erase(this,pIVar9,(ImGuiInputEvent *)((long)&pIVar9->Type + lVar15));
  }
  if ((pIVar6->IO).AppFocusLost == true) {
    ImGuiIO::ClearInputKeys(local_a0);
    (pIVar6->IO).AppFocusLost = false;
  }
  return;
}

Assistant:

void ImGui::UpdateInputEvents(bool trickle_fast_inputs)
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;

    // Only trickle chars<>key when working with InputText()
    // FIXME: InputText() could parse event trail?
    // FIXME: Could specialize chars<>keys trickling rules for control keys (those not typically associated to characters)
    const bool trickle_interleaved_keys_and_text = (trickle_fast_inputs && g.WantTextInputNextFrame == 1);

    bool mouse_moved = false, mouse_wheeled = false, key_changed = false, text_inputted = false;
    int  mouse_button_changed = 0x00;
    ImBitArray<ImGuiKey_KeysData_SIZE> key_changed_mask;

    int event_n = 0;
    for (; event_n < g.InputEventsQueue.Size; event_n++)
    {
        const ImGuiInputEvent* e = &g.InputEventsQueue[event_n];
        if (e->Type == ImGuiInputEventType_MousePos)
        {
            ImVec2 event_pos(e->MousePos.PosX, e->MousePos.PosY);
            if (IsMousePosValid(&event_pos))
                event_pos = ImVec2(ImFloorSigned(event_pos.x), ImFloorSigned(event_pos.y)); // Apply same flooring as UpdateMouseInputs()
            if (io.MousePos.x != event_pos.x || io.MousePos.y != event_pos.y)
            {
                // Trickling Rule: Stop processing queued events if we already handled a mouse button change
                if (trickle_fast_inputs && (mouse_button_changed != 0 || mouse_wheeled || key_changed || text_inputted))
                    break;
                io.MousePos = event_pos;
                mouse_moved = true;
            }
        }
        else if (e->Type == ImGuiInputEventType_MouseButton)
        {
            const ImGuiMouseButton button = e->MouseButton.Button;
            IM_ASSERT(button >= 0 && button < ImGuiMouseButton_COUNT);
            if (io.MouseDown[button] != e->MouseButton.Down)
            {
                // Trickling Rule: Stop processing queued events if we got multiple action on the same button
                if (trickle_fast_inputs && ((mouse_button_changed & (1 << button)) || mouse_wheeled))
                    break;
                io.MouseDown[button] = e->MouseButton.Down;
                mouse_button_changed |= (1 << button);
            }
        }
        else if (e->Type == ImGuiInputEventType_MouseWheel)
        {
            if (e->MouseWheel.WheelX != 0.0f || e->MouseWheel.WheelY != 0.0f)
            {
                // Trickling Rule: Stop processing queued events if we got multiple action on the event
                if (trickle_fast_inputs && (mouse_wheeled || mouse_button_changed != 0))
                    break;
                io.MouseWheelH += e->MouseWheel.WheelX;
                io.MouseWheel += e->MouseWheel.WheelY;
                mouse_wheeled = true;
            }
        }
        else if (e->Type == ImGuiInputEventType_Key)
        {
            ImGuiKey key = e->Key.Key;
            IM_ASSERT(key != ImGuiKey_None);
            const int keydata_index = (key - ImGuiKey_KeysData_OFFSET);
            ImGuiKeyData* keydata = &io.KeysData[keydata_index];
            if (keydata->Down != e->Key.Down || keydata->AnalogValue != e->Key.AnalogValue)
            {
                // Trickling Rule: Stop processing queued events if we got multiple action on the same button
                if (trickle_fast_inputs && keydata->Down != e->Key.Down && (key_changed_mask.TestBit(keydata_index) || text_inputted || mouse_button_changed != 0))
                    break;
                keydata->Down = e->Key.Down;
                keydata->AnalogValue = e->Key.AnalogValue;
                key_changed = true;
                key_changed_mask.SetBit(keydata_index);

                if (key == ImGuiKey_ModCtrl || key == ImGuiKey_ModShift || key == ImGuiKey_ModAlt || key == ImGuiKey_ModSuper)
                {
                    if (key == ImGuiKey_ModCtrl) { io.KeyCtrl = keydata->Down; }
                    if (key == ImGuiKey_ModShift) { io.KeyShift = keydata->Down; }
                    if (key == ImGuiKey_ModAlt) { io.KeyAlt = keydata->Down; }
                    if (key == ImGuiKey_ModSuper) { io.KeySuper = keydata->Down; }
                    io.KeyMods = GetMergedKeyModFlags();
                }

                // Allow legacy code using io.KeysDown[GetKeyIndex()] with new backends
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
                io.KeysDown[key] = keydata->Down;
                if (io.KeyMap[key] != -1)
                    io.KeysDown[io.KeyMap[key]] = keydata->Down;
#endif
            }
        }
        else if (e->Type == ImGuiInputEventType_Text)
        {
            // Trickling Rule: Stop processing queued events if keys/mouse have been interacted with
            if (trickle_fast_inputs && ((key_changed && trickle_interleaved_keys_and_text) || mouse_button_changed != 0 || mouse_moved || mouse_wheeled))
                break;
            unsigned int c = e->Text.Char;
            io.InputQueueCharacters.push_back(c <= IM_UNICODE_CODEPOINT_MAX ? (ImWchar)c : IM_UNICODE_CODEPOINT_INVALID);
            if (trickle_interleaved_keys_and_text)
                text_inputted = true;
        }
        else if (e->Type == ImGuiInputEventType_Focus)
        {
            // We intentionally overwrite this and process lower, in order to give a chance
            // to multi-viewports backends to queue AddFocusEvent(false) + AddFocusEvent(true) in same frame.
            io.AppFocusLost = !e->AppFocused.Focused;
        }
        else
        {
            IM_ASSERT(0 && "Unknown event!");
        }
    }

    // Record trail (for domain-specific applications wanting to access a precise trail)
    //if (event_n != 0) IMGUI_DEBUG_LOG("Processed: %d / Remaining: %d\n", event_n, g.InputEventsQueue.Size - event_n);
    for (int n = 0; n < event_n; n++)
        g.InputEventsTrail.push_back(g.InputEventsQueue[n]);

    // [DEBUG]
    /*if (event_n != 0)
        for (int n = 0; n < g.InputEventsQueue.Size; n++)
            DebugLogInputEvent(n < event_n ? "Processed" : "Remaining", &g.InputEventsQueue[n]);*/

    // Remaining events will be processed on the next frame
    if (event_n == g.InputEventsQueue.Size)
        g.InputEventsQueue.resize(0);
    else
        g.InputEventsQueue.erase(g.InputEventsQueue.Data, g.InputEventsQueue.Data + event_n);

    // Clear buttons state when focus is lost
    // (this is useful so e.g. releasing Alt after focus loss on Alt-Tab doesn't trigger the Alt menu toggle)
    if (g.IO.AppFocusLost)
    {
        g.IO.ClearInputKeys();
        g.IO.AppFocusLost = false;
    }
}